

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

double __thiscall dynamicgraph::command::Value::doubleValue(Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_3d;
  int local_3c;
  string local_38;
  
  if (this->type_ == DOUBLE) {
    return *this->value_;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_3c = 700;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"value is not a double",&local_3d);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_3c,&local_38);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

double Value::doubleValue() const {
  double result;
  if (DOUBLE != type_)
    throw ExceptionAbstract(ExceptionAbstract::TOOLS, "value is not a double");
  result = *((const double *)value_);
  return result;
}